

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSFFile.cpp
# Opt level: O2

bool PSFFile::save(string *filename,uint8_t version,uint8_t *reserved,uint32_t reserved_size,
                  uint8_t *compressed_exe,uint32_t compressed_exe_size,
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  tags)

{
  int iVar1;
  FILE *__s;
  size_t sVar2;
  istream *piVar3;
  _Rb_tree_node_base *p_Var4;
  uint8_t data [4];
  string line;
  istringstream value_reader;
  
  __s = fopen((filename->_M_dataplus)._M_p,"wb");
  if (__s != (FILE *)0x0) {
    sVar2 = fwrite("PSF",1,3,__s);
    if ((((sVar2 == 3) && (iVar1 = fputc((uint)version,__s), iVar1 != -1)) &&
        (data = (uint8_t  [4])reserved_size, sVar2 = fwrite(data,1,4,__s), sVar2 == 4)) &&
       (data = (uint8_t  [4])compressed_exe_size, sVar2 = fwrite(data,1,4,__s), sVar2 == 4)) {
      if (compressed_exe == (uint8_t *)0x0) {
        data[0] = '\0';
        data[1] = '\0';
        data[2] = '\0';
        data[3] = '\0';
      }
      else {
        data = (uint8_t  [4])crc32(0,compressed_exe,compressed_exe_size);
      }
      sVar2 = fwrite(data,1,4,__s);
      if (((sVar2 == 4) &&
          ((reserved_size == 0 || reserved == (uint8_t *)0x0 ||
           (sVar2 = fwrite(reserved,1,(ulong)reserved_size,__s), sVar2 == reserved_size)))) &&
         ((compressed_exe_size == 0 || compressed_exe == (uint8_t *)0x0 ||
          (sVar2 = fwrite(compressed_exe,1,(ulong)compressed_exe_size,__s),
          sVar2 == compressed_exe_size)))) {
        if (*(long *)(tags._M_t._M_impl._0_8_ + 0x28) == 0) {
LAB_00106e04:
          fclose(__s);
          return true;
        }
        sVar2 = fwrite("[TAG]",1,5,__s);
        if (sVar2 == 5) {
          for (p_Var4 = *(_Rb_tree_node_base **)(tags._M_t._M_impl._0_8_ + 0x18);
              p_Var4 != (_Rb_tree_node_base *)(tags._M_t._M_impl._0_8_ + 8);
              p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
            std::__cxx11::istringstream::istringstream
                      ((istringstream *)&value_reader,(string *)(p_Var4 + 2),_S_in);
            line._M_dataplus._M_p = (pointer)&line.field_2;
            line._M_string_length = 0;
            line.field_2._M_local_buf[0] = '\0';
            while (piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                      ((istream *)&value_reader,(string *)&line),
                  ((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
              iVar1 = fprintf(__s,"%s=%s\n",*(undefined8 *)(p_Var4 + 1),line._M_dataplus._M_p);
              if (iVar1 < 0) {
                fclose(__s);
                std::__cxx11::string::~string((string *)&line);
                std::__cxx11::istringstream::~istringstream((istringstream *)&value_reader);
                return false;
              }
            }
            std::__cxx11::string::~string((string *)&line);
            std::__cxx11::istringstream::~istringstream((istringstream *)&value_reader);
          }
          goto LAB_00106e04;
        }
      }
    }
    fclose(__s);
  }
  return false;
}

Assistant:

bool PSFFile::save(const std::string& filename, uint8_t version, const uint8_t * reserved, uint32_t reserved_size, const uint8_t * compressed_exe, uint32_t compressed_exe_size, std::map<std::string, std::string> tags)
{
	uint8_t data[4];

	FILE * fp = fopen(filename.c_str(), "wb");
	if (fp == NULL)
	{
		return false;
	}

	// signature
	if (fwrite(PSF_SIGNATURE, 1, PSF_SIGNATURE_SIZE, fp) != PSF_SIGNATURE_SIZE)
	{
		fclose(fp);
		return false;
	}

	// version
	if (fputc(version, fp) == EOF)
	{
		fclose(fp);
		return false;
	}

	// size of reserved area
	data[0] = reserved_size & 0xff;
	data[1] = (reserved_size >> 8) & 0xff;
	data[2] = (reserved_size >> 16) & 0xff;
	data[3] = (reserved_size >> 24) & 0xff;
	if (fwrite(data, 1, 4, fp) != 4)
	{
		fclose(fp);
		return false;
	}

	// size of program area
	data[0] = compressed_exe_size & 0xff;
	data[1] = (compressed_exe_size >> 8) & 0xff;
	data[2] = (compressed_exe_size >> 16) & 0xff;
	data[3] = (compressed_exe_size >> 24) & 0xff;
	if (fwrite(data, 1, 4, fp) != 4)
	{
		fclose(fp);
		return false;
	}

	// crc32 of program area
	uint32_t exe_crc = (compressed_exe != NULL) ? crc32(0L, compressed_exe, compressed_exe_size) : 0;
	data[0] = exe_crc & 0xff;
	data[1] = (exe_crc >> 8) & 0xff;
	data[2] = (exe_crc >> 16) & 0xff;
	data[3] = (exe_crc >> 24) & 0xff;
	if (fwrite(data, 1, 4, fp) != 4)
	{
		fclose(fp);
		return false;
	}

	// reserved area
	if (reserved != NULL && reserved_size != 0)
	{
		if (fwrite(reserved, 1, reserved_size, fp) != reserved_size)
		{
			fclose(fp);
			return false;
		}
	}

	// program area
	if (compressed_exe != NULL && compressed_exe_size != 0)
	{
		if (fwrite(compressed_exe, 1, compressed_exe_size, fp) != compressed_exe_size)
		{
			fclose(fp);
			return false;
		}
	}

	// tags
	if (!tags.empty())
	{
		if (fwrite(PSF_TAG_MARKER, 1, PSF_TAG_MARKER_SIZE, fp) != PSF_TAG_MARKER_SIZE)
		{
			fclose(fp);
			return false;
		}

		for (std::map<std::string, std::string>::iterator it = tags.begin(); it != tags.end(); ++it)
		{
			const std::string& key = it->first;
			const std::string& value = it->second;
			std::istringstream value_reader(value);
			std::string line;

			// process for each lines
			while (std::getline(value_reader, line))
			{
				if (fprintf(fp, "%s=%s\n", key.c_str(), line.c_str()) < 0)
				{
					fclose(fp);
					return false;
				}
			}
		}
	}

	fclose(fp);
	return true;
}